

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.h
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::pushScope(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,ScopeCtx *scope)

{
  __index_type *__rhs;
  size_t *psVar1;
  uintptr_t uVar2;
  bool bVar3;
  mapped_type *this_00;
  Index local;
  string_view sVar4;
  string local_a8 [32];
  undefined1 local_88 [8];
  Result<unsigned_int> _val;
  Name label;
  char local_40;
  
  join_0x00000010_0x00000000_ = (string_view)ScopeCtx::getOriginalLabel(scope);
  if (_val._40_8_ != (char *)0x0) {
    if ((scope->label).super_IString.str._M_str == (char *)0x0) {
      sVar4 = (string_view)makeFresh(this,(Name)join_0x00000010_0x00000000_,0);
      (scope->label).super_IString.str = sVar4;
    }
    this_00 = std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->labelDepths,
                           (key_type *)
                           ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                   super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                   super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                   super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                   super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    local_88._0_4_ =
         (int)(((long)(this->scopeStack).
                      super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->scopeStack).
                     super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xb0) + 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)local_88);
  }
  psVar1 = this->binaryPos;
  if (psVar1 != (size_t *)0x0) {
    scope->startPos = this->lastBinaryPos;
    this->lastBinaryPos = *psVar1;
  }
  uVar2 = (scope->inputType).id;
  local = scope->inputLocal;
  if ((uVar2 == 0) || (bVar3 = ScopeCtx::isDelimiter(scope), bVar3)) {
LAB_00ce3423:
    std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::
    emplace_back<wasm::IRBuilder::ScopeCtx>(&this->scopeStack,scope);
    if (uVar2 != 0) {
      makeLocalGet((Result<wasm::Ok> *)
                   ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),this,local);
      if (local_40 == '\x01') {
        std::__cxx11::string::string
                  ((string *)local_88,
                   (string *)
                   ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_88);
        goto LAB_00ce3466;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    }
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  }
  else {
    if (local == 0xffffffff) {
      __rhs = (__index_type *)
              ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                      super__Move_assign_alias<unsigned_int,_wasm::Err>.
                      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                      super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20);
      addScratchLocal((Result<unsigned_int> *)__rhs,this,(Type)(scope->inputType).id);
      std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_88,
                 (_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)__rhs);
      if (_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string(local_a8,(string *)local_88);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_a8);
        std::__cxx11::string::~string(local_a8);
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_88);
        local = 0xffffffff;
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_88);
        scope->inputLocal =
             _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_4_;
        local = _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                super__Move_assign_alias<unsigned_int,_wasm::Err>.
                super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_4_;
      }
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
                 ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
      if (_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_ == '\x01') {
        return __return_storage_ptr__;
      }
    }
    makeLocalSet((Result<wasm::Ok> *)
                 ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),this,local);
    if (local_40 != '\x01') {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
      goto LAB_00ce3423;
    }
    std::__cxx11::string::string
              ((string *)local_88,
               (string *)
               ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_88);
LAB_00ce3466:
    std::__cxx11::string::~string((string *)local_88);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
               ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> pushScope(ScopeCtx&& scope) {
    if (auto label = scope.getOriginalLabel()) {
      // Assign a fresh label to the scope, if necessary.
      if (!scope.label) {
        scope.label = makeFresh(label);
      }
      // Record the original label to handle references to it correctly.
      labelDepths[label].push_back(scopeStack.size() + 1);
    }
    if (binaryPos) {
      scope.startPos = lastBinaryPos;
      lastBinaryPos = *binaryPos;
    }
    bool hasInput = scope.inputType != Type::none;
    Index inputLocal = scope.inputLocal;
    if (hasInput && !scope.isDelimiter()) {
      if (inputLocal == Index(-1)) {
        auto scratch = addScratchLocal(scope.inputType);
        CHECK_ERR(scratch);
        inputLocal = scope.inputLocal = *scratch;
      }
      CHECK_ERR(makeLocalSet(inputLocal));
    }
    scopeStack.emplace_back(std::move(scope));
    if (hasInput) {
      CHECK_ERR(makeLocalGet(inputLocal));
    }
    return Ok{};
  }